

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  size_t sVar1;
  undefined8 uVar2;
  ZSTD_compressionParameters local_e4;
  undefined4 uStack_c8;
  uint uStack_c4;
  ZSTD_CCtx_params params;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CStream *zcs_local;
  ZSTD_frameParameters fParams_local;
  
  uVar2 = fParams._0_8_;
  if (cdict == (ZSTD_CDict *)0x0) {
    fParams_local.checksumFlag = -0x20;
    fParams_local.noDictIDFlag = -1;
  }
  else {
    params.customMem.opaque = (void *)pledgedSrcSize;
    memcpy(&uStack_c8,&zcs->requestedParams,0x80);
    ZSTD_getCParamsFromCDict(&local_e4,cdict);
    uStack_c4 = local_e4.windowLog;
    params.format = local_e4.chainLog;
    params.cParams.windowLog = local_e4.hashLog;
    params.cParams.chainLog = local_e4.searchLog;
    params.cParams.hashLog = local_e4.minMatch;
    params.cParams.searchLog = local_e4.targetLength;
    params.cParams.minMatch = local_e4.strategy;
    params_00.cParams.windowLog = uStack_c4;
    params_00.format = uStack_c8;
    params_00.cParams.hashLog = params.cParams.windowLog;
    params_00.cParams.chainLog = params.format;
    params_00.cParams.minMatch = params.cParams.hashLog;
    params_00.cParams.searchLog = params.cParams.chainLog;
    params_00.cParams.strategy = local_e4.strategy;
    params_00.cParams.targetLength = params.cParams.searchLog;
    params_00.compressionLevel = params.fParams.checksumFlag;
    params_00.fParams.noDictIDFlag = fParams.noDictIDFlag;
    params_00.fParams.contentSizeFlag = (uint)uVar2;
    params_00.fParams.checksumFlag = SUB84(uVar2,4);
    params_00.forceWindow = params.fParams.noDictIDFlag;
    params_00.attachDictPref = params.compressionLevel;
    params_00.nbWorkers = params.forceWindow;
    params_00._60_4_ = params.attachDictPref;
    params_00.jobSize = params._56_8_;
    params_00.overlapLog = (undefined4)params.jobSize;
    params_00.rsyncable = params.jobSize._4_4_;
    params_00.ldmParams.enableLdm = params.overlapLog;
    params_00.ldmParams.hashLog = params.rsyncable;
    params_00.ldmParams.bucketSizeLog = params.ldmParams.enableLdm;
    params_00.ldmParams.minMatchLength = params.ldmParams.hashLog;
    params_00.ldmParams.hashRateLog = params.ldmParams.bucketSizeLog;
    params_00.ldmParams.windowLog = params.ldmParams.minMatchLength;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)params.ldmParams._16_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)params.customMem.customAlloc;
    params_00.customMem.opaque = params.customMem.customFree;
    params.cParams._20_8_ = uVar2;
    params.fParams.contentSizeFlag = fParams.noDictIDFlag;
    fParams_local._4_8_ =
         ZSTD_initCStream_internal
                   (zcs,(void *)0x0,0,cdict,params_00,(unsigned_long_long)params.customMem.opaque);
  }
  sVar1._0_4_ = fParams_local.checksumFlag;
  sVar1._4_4_ = fParams_local.noDictIDFlag;
  return sVar1;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    if (!cdict) return ERROR(dictionary_wrong); /* cannot handle NULL cdict (does not know what to do) */
    {   ZSTD_CCtx_params params = zcs->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        params.fParams = fParams;
        return ZSTD_initCStream_internal(zcs,
                                NULL, 0, cdict,
                                params, pledgedSrcSize);
    }
}